

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBStringList *l)

{
  const_reference pvVar1;
  uchar *puVar2;
  CBStringException *this_00;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  allocator local_79;
  string local_78;
  CBStringException bstr__cppwrapper_exception;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a1870;
  iVar5 = 1;
  uVar4 = 0;
  while( true ) {
    lVar3 = *(long *)l;
    lVar6 = *(long *)(l + 8);
    if ((ulong)((lVar6 - lVar3) / 0x18) <= uVar4) break;
    pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar4);
    iVar5 = iVar5 + (pvVar1->super_tagbstring).slen;
    uVar4 = uVar4 + 1;
  }
  (this->super_tagbstring).mlen = iVar5;
  (this->super_tagbstring).slen = 0;
  puVar2 = (uchar *)malloc((long)iVar5);
  (this->super_tagbstring).data = puVar2;
  if (puVar2 != (uchar *)0x0) {
    for (uVar4 = 0; uVar4 < (ulong)((lVar6 - lVar3) / 0x18); uVar4 = uVar4 + 1) {
      pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                         ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar4);
      operator+=(this,pvVar1);
      lVar3 = *(long *)l;
      lVar6 = *(long *)(l + 8);
    }
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  std::__cxx11::string::string
            ((string *)&local_78,"CBString::Failure in (CBStringList) constructor",&local_79);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const CBStringList& l) {
int c;
size_t i;

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen;
	}

	mlen = c;
	slen = 0;
	data = (unsigned char *) bstr__alloc (c);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			*this += l.at(i);
		}
	}
}